

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCapsuleShape.cpp
# Opt level: O0

void __thiscall
btCapsuleShape::calculateLocalInertia(btCapsuleShape *this,btScalar mass,btVector3 *inertia)

{
  int iVar1;
  btScalar *pbVar2;
  btVector3 *in_RSI;
  btTransform *in_RDI;
  float in_XMM0_Da;
  btScalar bVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  btScalar scaledmass;
  btScalar z2;
  btScalar y2;
  btScalar x2;
  btScalar lz;
  btScalar ly;
  btScalar lx;
  btScalar margin;
  btVector3 halfExtents;
  btScalar radius;
  btTransform ident;
  btTransform *in_stack_ffffffffffffff60;
  btVector3 local_6c;
  btScalar local_5c [17];
  btVector3 *local_18;
  float local_c;
  
  local_18 = in_RSI;
  local_c = in_XMM0_Da;
  btTransform::btTransform(in_RDI);
  btTransform::setIdentity(in_stack_ffffffffffffff60);
  local_5c[0] = getRadius((btCapsuleShape *)in_RDI);
  btVector3::btVector3(&local_6c,local_5c,local_5c,local_5c);
  bVar3 = getHalfHeight((btCapsuleShape *)in_RDI);
  pbVar2 = btVector3::operator_cast_to_float_(&local_6c);
  iVar1 = getUpAxis((btCapsuleShape *)in_RDI);
  pbVar2[iVar1] = bVar3 + pbVar2[iVar1];
  pbVar2 = btVector3::operator_cast_to_float_(&local_6c);
  fVar4 = (*pbVar2 + 0.04) * 2.0;
  pbVar2 = btVector3::operator_cast_to_float_(&local_6c);
  fVar5 = (pbVar2[1] + 0.04) * 2.0;
  pbVar2 = btVector3::operator_cast_to_float_(&local_6c);
  fVar6 = (pbVar2[2] + 0.04) * 2.0;
  fVar4 = fVar4 * fVar4;
  fVar5 = fVar5 * fVar5;
  fVar6 = fVar6 * fVar6;
  fVar7 = local_c * 0.08333333;
  pbVar2 = btVector3::operator_cast_to_float_(local_18);
  *pbVar2 = fVar7 * (fVar5 + fVar6);
  pbVar2 = btVector3::operator_cast_to_float_(local_18);
  pbVar2[1] = fVar7 * (fVar4 + fVar6);
  pbVar2 = btVector3::operator_cast_to_float_(local_18);
  pbVar2[2] = fVar7 * (fVar4 + fVar5);
  return;
}

Assistant:

void	btCapsuleShape::calculateLocalInertia(btScalar mass,btVector3& inertia) const
{
	//as an approximation, take the inertia of the box that bounds the spheres

	btTransform ident;
	ident.setIdentity();

	
	btScalar radius = getRadius();

	btVector3 halfExtents(radius,radius,radius);
	halfExtents[getUpAxis()]+=getHalfHeight();

	btScalar margin = CONVEX_DISTANCE_MARGIN;

	btScalar lx=btScalar(2.)*(halfExtents[0]+margin);
	btScalar ly=btScalar(2.)*(halfExtents[1]+margin);
	btScalar lz=btScalar(2.)*(halfExtents[2]+margin);
	const btScalar x2 = lx*lx;
	const btScalar y2 = ly*ly;
	const btScalar z2 = lz*lz;
	const btScalar scaledmass = mass * btScalar(.08333333);

	inertia[0] = scaledmass * (y2+z2);
	inertia[1] = scaledmass * (x2+z2);
	inertia[2] = scaledmass * (x2+y2);

}